

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

void glfwSetGamma(GLFWmonitor *handle,float gamma)

{
  GLFWgammaramp *pGVar1;
  unsigned_short *block;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  GLFWgammaramp ramp;
  GLFWgammaramp local_40;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("handle != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/glfw/src/monitor.c"
                  ,0x1cc,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (gamma <= 0.0) {
    __assert_fail("gamma > 0.f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/glfw/src/monitor.c"
                  ,0x1cd,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (3.4028235e+38 < gamma) {
    __assert_fail("gamma <= FLT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/glfw/src/monitor.c"
                  ,0x1ce,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (_glfw.initialized != 0) {
    if (3.4028235e+38 < gamma) {
      _glfwInputError(0x10004,"Invalid gamma value %f",(double)gamma);
      return;
    }
    pGVar1 = glfwGetGammaRamp(handle);
    if (pGVar1 != (GLFWgammaramp *)0x0) {
      block = (unsigned_short *)_glfw_calloc((ulong)pGVar1->size,2);
      local_40.size = pGVar1->size;
      uVar2 = (ulong)local_40.size;
      if (local_40.size != 0) {
        uVar3 = 0;
        do {
          fVar4 = powf((float)(uVar3 & 0xffffffff) / (float)((int)uVar2 - 1),1.0 / gamma);
          fVar4 = _glfw_fminf(fVar4 * 65535.0 + 0.5,65535.0);
          block[uVar3] = (unsigned_short)(int)fVar4;
          uVar3 = uVar3 + 1;
          local_40.size = pGVar1->size;
          uVar2 = (ulong)local_40.size;
        } while (uVar3 < uVar2);
      }
      local_40.red = block;
      local_40.green = block;
      local_40.blue = block;
      glfwSetGammaRamp(handle,&local_40);
      _glfw_free(block);
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSetGamma(GLFWmonitor* handle, float gamma)
{
    unsigned int i;
    unsigned short* values;
    GLFWgammaramp ramp;
    const GLFWgammaramp* original;
    assert(handle != NULL);
    assert(gamma > 0.f);
    assert(gamma <= FLT_MAX);

    _GLFW_REQUIRE_INIT();

    if (gamma != gamma || gamma <= 0.f || gamma > FLT_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid gamma value %f", gamma);
        return;
    }

    original = glfwGetGammaRamp(handle);
    if (!original)
        return;

    values = _glfw_calloc(original->size, sizeof(unsigned short));

    for (i = 0;  i < original->size;  i++)
    {
        float value;

        // Calculate intensity
        value = i / (float) (original->size - 1);
        // Apply gamma curve
        value = powf(value, 1.f / gamma) * 65535.f + 0.5f;
        // Clamp to value range
        value = _glfw_fminf(value, 65535.f);

        values[i] = (unsigned short) value;
    }

    ramp.red = values;
    ramp.green = values;
    ramp.blue = values;
    ramp.size = original->size;

    glfwSetGammaRamp(handle, &ramp);
    _glfw_free(values);
}